

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCOpenings.cpp
# Opt level: O0

void Assimp::IFC::FindBorderContours(iterator current)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  reference pPVar4;
  SkipList *this;
  difference_type dVar5;
  size_type sVar6;
  reference local_c8;
  aiVector2t<double> local_b8;
  reference local_a8;
  IfcVector2 *proj_point_1;
  aiVector2t<double> *local_98;
  reference local_90;
  aiVector2t<double> local_80;
  aiVector2t<double> *local_70;
  IfcVector2 *proj_point;
  const_iterator cit;
  __normal_iterator<const_aiVector2t<double>_*,_std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>_>
  local_58;
  const_iterator cend;
  __normal_iterator<const_aiVector2t<double>_*,_std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>_>
  local_48;
  const_iterator cbegin;
  IfcVector2 last_proj_point;
  SkipList *skiplist;
  bool start_on_outer_border;
  bool outer_border;
  IfcFloat border_epsilon_lower;
  IfcFloat border_epsilon_upper;
  iterator current_local;
  
  bVar3 = false;
  bVar1 = false;
  border_epsilon_upper = (IfcFloat)current._M_current;
  pPVar4 = __gnu_cxx::
           __normal_iterator<Assimp::IFC::ProjectedWindowContour_*,_std::vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>_>
           ::operator*((__normal_iterator<Assimp::IFC::ProjectedWindowContour_*,_std::vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>_>
                        *)&border_epsilon_upper);
  this = &pPVar4->skiplist;
  aiVector2t<double>::aiVector2t((aiVector2t<double> *)&cbegin);
  pPVar4 = __gnu_cxx::
           __normal_iterator<Assimp::IFC::ProjectedWindowContour_*,_std::vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>_>
           ::operator*((__normal_iterator<Assimp::IFC::ProjectedWindowContour_*,_std::vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>_>
                        *)&border_epsilon_upper);
  cend._M_current =
       (aiVector2t<double> *)
       std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::begin
                 (&pPVar4->contour);
  __gnu_cxx::
  __normal_iterator<aiVector2t<double>const*,std::vector<aiVector2t<double>,std::allocator<aiVector2t<double>>>>
  ::__normal_iterator<aiVector2t<double>*>
            ((__normal_iterator<aiVector2t<double>const*,std::vector<aiVector2t<double>,std::allocator<aiVector2t<double>>>>
              *)&local_48,
             (__normal_iterator<aiVector2t<double>_*,_std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>_>
              *)&cend);
  pPVar4 = __gnu_cxx::
           __normal_iterator<Assimp::IFC::ProjectedWindowContour_*,_std::vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>_>
           ::operator*((__normal_iterator<Assimp::IFC::ProjectedWindowContour_*,_std::vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>_>
                        *)&border_epsilon_upper);
  cit._M_current =
       (aiVector2t<double> *)
       std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::end(&pPVar4->contour);
  __gnu_cxx::
  __normal_iterator<aiVector2t<double>const*,std::vector<aiVector2t<double>,std::allocator<aiVector2t<double>>>>
  ::__normal_iterator<aiVector2t<double>*>
            ((__normal_iterator<aiVector2t<double>const*,std::vector<aiVector2t<double>,std::allocator<aiVector2t<double>>>>
              *)&local_58,
             (__normal_iterator<aiVector2t<double>_*,_std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>_>
              *)&cit);
  proj_point = local_48._M_current;
  do {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_aiVector2t<double>_*,_std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>_>
                        *)&proj_point,&local_58);
    if (!bVar2) {
      if ((bVar3) && (bVar1)) {
        local_a8 = __gnu_cxx::
                   __normal_iterator<const_aiVector2t<double>_*,_std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>_>
                   ::operator*(&local_48);
        local_b8 = ::operator-(local_a8,(aiVector2t<double> *)&cbegin);
        bVar3 = LikelyBorder(&local_b8);
        if (bVar3) {
          sVar6 = std::vector<bool,_std::allocator<bool>_>::size(this);
          local_c8 = std::vector<bool,_std::allocator<bool>_>::operator[](this,sVar6 - 1);
          std::_Bit_reference::operator=(&local_c8,true);
        }
      }
      return;
    }
    local_70 = __gnu_cxx::
               __normal_iterator<const_aiVector2t<double>_*,_std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>_>
               ::operator*((__normal_iterator<const_aiVector2t<double>_*,_std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>_>
                            *)&proj_point);
    if ((((local_70->x <= 0.0001) || (0.9999 <= local_70->x)) || (local_70->y <= 0.0001)) ||
       (0.9999 <= local_70->y)) {
      if (bVar3) {
        bVar3 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_aiVector2t<double>_*,_std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>_>
                            *)&proj_point,&local_48);
        if (!bVar3) {
          __assert_fail("cit != cbegin",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Importer/IFC/IFCOpenings.cpp"
                        ,0x315,"void Assimp::IFC::FindBorderContours(ContourVector::iterator)");
        }
        local_80 = ::operator-(local_70,(aiVector2t<double> *)&cbegin);
        bVar3 = LikelyBorder(&local_80);
        if (bVar3) {
          local_98 = local_48._M_current;
          proj_point_1 = proj_point;
          dVar5 = std::
                  distance<__gnu_cxx::__normal_iterator<aiVector2t<double>const*,std::vector<aiVector2t<double>,std::allocator<aiVector2t<double>>>>>
                            (local_48,(__normal_iterator<const_aiVector2t<double>_*,_std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>_>
                                       )proj_point);
          local_90 = std::vector<bool,_std::allocator<bool>_>::operator[](this,dVar5 - 1);
          std::_Bit_reference::operator=(&local_90,true);
        }
      }
      else {
        bVar3 = __gnu_cxx::operator==
                          ((__normal_iterator<const_aiVector2t<double>_*,_std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>_>
                            *)&proj_point,&local_48);
        if (bVar3) {
          bVar1 = true;
        }
      }
      bVar3 = true;
    }
    else {
      bVar3 = false;
    }
    cbegin._M_current = (aiVector2t<double> *)local_70->x;
    __gnu_cxx::
    __normal_iterator<const_aiVector2t<double>_*,_std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>_>
    ::operator++((__normal_iterator<const_aiVector2t<double>_*,_std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>_>
                  *)&proj_point);
  } while( true );
}

Assistant:

void FindBorderContours(ContourVector::iterator current)
{
    const IfcFloat border_epsilon_upper = static_cast<IfcFloat>(1-1e-4);
    const IfcFloat border_epsilon_lower = static_cast<IfcFloat>(1e-4);

    bool outer_border = false;
    bool start_on_outer_border = false;

    SkipList& skiplist = (*current).skiplist;
    IfcVector2 last_proj_point;

    const Contour::const_iterator cbegin = (*current).contour.begin(), cend = (*current).contour.end();

    for (Contour::const_iterator cit = cbegin; cit != cend; ++cit) {
        const IfcVector2& proj_point = *cit;

        // Check if this connection is along the outer boundary of the projection
        // plane. In such a case we better drop it because such 'edges' should
        // not have any geometry to close them (think of door openings).
        if (proj_point.x <= border_epsilon_lower || proj_point.x >= border_epsilon_upper ||
            proj_point.y <= border_epsilon_lower || proj_point.y >= border_epsilon_upper) {

                if (outer_border) {
                    ai_assert(cit != cbegin);
                    if (LikelyBorder(proj_point - last_proj_point)) {
                        skiplist[std::distance(cbegin, cit) - 1] = true;
                    }
                }
                else if (cit == cbegin) {
                    start_on_outer_border = true;
                }

                outer_border = true;
        }
        else {
            outer_border = false;
        }

        last_proj_point = proj_point;
    }

    // handle last segment
    if (outer_border && start_on_outer_border) {
        const IfcVector2& proj_point = *cbegin;
        if (LikelyBorder(proj_point - last_proj_point)) {
            skiplist[skiplist.size()-1] = true;
        }
    }
}